

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS ref_interp_create_identity(REF_INTERP *ref_interp_ptr,REF_GRID to_grid)

{
  double dVar1;
  REF_INTERP ref_interp;
  REF_NODE pRVar2;
  REF_INTERP ref_interp_00;
  uint uVar3;
  long lVar4;
  REF_INT *cell;
  undefined8 uVar5;
  long lVar6;
  REF_DBL *pRVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  REF_GRID from_grid;
  REF_DBL max_error;
  REF_GRID local_40;
  double local_38;
  
  uVar3 = ref_grid_deep_copy(&local_40,to_grid);
  if (uVar3 == 0) {
    uVar3 = ref_interp_create(ref_interp_ptr,local_40,to_grid);
    if (uVar3 == 0) {
      ref_interp = *ref_interp_ptr;
      pRVar2 = to_grid->node;
      ref_interp->continuously = 1;
      if (0 < pRVar2->max) {
        lVar6 = 0;
        lVar10 = 0;
        uVar9 = 0;
        do {
          if ((-1 < *(long *)((long)pRVar2->global + lVar6 * 2)) &&
             (pRVar2->ref_mpi->id == *(int *)((long)pRVar2->part + lVar6))) {
            lVar4 = (long)*(int *)((long)ref_interp->cell + lVar6);
            if (lVar4 != -1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x102,"ref_interp_create_identity","identity already found?",
                     0xffffffffffffffff,lVar4);
              return 1;
            }
            pRVar7 = (REF_DBL *)((long)ref_interp->cell + lVar6);
            cell = (REF_INT *)((long)pRVar2->real + lVar10);
            ref_interp_00 = (REF_INTERP)ref_interp->from_grid->node;
            if (to_grid->twod == 0) {
              uVar3 = ref_interp_exhaustive_tet_around_node
                                (ref_interp_00,(REF_INT)ref_interp->from_tet,
                                 (REF_DBL *)(uVar9 & 0xffffffff),cell,pRVar7);
              if (uVar3 != 0) {
                pcVar8 = "tet around node";
                uVar5 = 0x10c;
                goto LAB_0015faeb;
              }
            }
            else {
              uVar3 = ref_interp_exhaustive_tri_around_node
                                (ref_interp_00,(REF_INT)ref_interp->from_tri,
                                 (REF_DBL *)(uVar9 & 0xffffffff),cell,pRVar7);
              if (uVar3 != 0) {
                pcVar8 = "tri around node";
                uVar5 = 0x107;
                goto LAB_0015faeb;
              }
            }
            *(REF_INT *)((long)ref_interp->part + lVar6) = local_40->mpi->id;
            pRVar7 = ref_interp->bary;
            dVar1 = ref_interp->inside;
            if ((((pRVar7[lVar6] < dVar1) || (pRVar7[lVar6 + 1] < dVar1)) ||
                (pRVar7[lVar6 + 2] < dVar1)) || (pRVar7[lVar6 + 3] < dVar1)) {
              printf("info bary %e %e %e %e identity tol\n",pRVar7[lVar6],pRVar7[lVar6 + 1],
                     pRVar7[lVar6 + 2],pRVar7[lVar6 + 3]);
            }
          }
          uVar9 = uVar9 + 1;
          lVar10 = lVar10 + 0x78;
          lVar6 = lVar6 + 4;
        } while ((long)uVar9 < (long)pRVar2->max);
      }
      uVar3 = ref_interp_max_error(ref_interp,&local_38);
      if (uVar3 == 0) {
        if (to_grid->mpi->id != 0) {
          return 0;
        }
        if (local_38 <= 1e-12) {
          return 0;
        }
        printf("warning %e max error for identity background grid\n");
        return 0;
      }
      pcVar8 = "max error";
      uVar5 = 0x117;
    }
    else {
      pcVar8 = "create";
      uVar5 = 0xf9;
    }
  }
  else {
    pcVar8 = "import";
    uVar5 = 0xf8;
  }
LAB_0015faeb:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar5,
         "ref_interp_create_identity",(ulong)uVar3,pcVar8);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_interp_create_identity(REF_INTERP *ref_interp_ptr,
                                              REF_GRID to_grid) {
  REF_INTERP ref_interp;
  REF_GRID from_grid;
  REF_NODE to_node;
  REF_INT node;
  REF_DBL max_error;

  RSS(ref_grid_deep_copy(&from_grid, to_grid), "import");
  RSS(ref_interp_create(ref_interp_ptr, from_grid, to_grid), "create");

  ref_interp = *ref_interp_ptr;
  to_node = ref_grid_node(to_grid);

  ref_interp_continuously(ref_interp) = REF_TRUE;

  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node)) {
      REIS(REF_EMPTY, ref_interp->cell[node], "identity already found?");
      if (ref_grid_twod(to_grid)) {
        RSS(ref_interp_exhaustive_tri_around_node(
                ref_interp, node, ref_node_xyz_ptr(to_node, node),
                &(ref_interp->cell[node]), &(ref_interp->bary[4 * node])),
            "tri around node");
      } else {
        RSS(ref_interp_exhaustive_tet_around_node(
                ref_interp, node, ref_node_xyz_ptr(to_node, node),
                &(ref_interp->cell[node]), &(ref_interp->bary[4 * node])),
            "tet around node");
      }
      ref_interp->part[node] = ref_mpi_rank(ref_grid_mpi(from_grid));
      if (!ref_interp_bary_inside(ref_interp, &(ref_interp->bary[4 * node]))) {
        printf("info bary %e %e %e %e identity tol\n",
               ref_interp->bary[0 + 4 * node], ref_interp->bary[1 + 4 * node],
               ref_interp->bary[2 + 4 * node], ref_interp->bary[3 + 4 * node]);
      }
    }
  }

  RSS(ref_interp_max_error(ref_interp, &max_error), "max error");
  if (ref_mpi_once(ref_grid_mpi(to_grid)) && max_error > 1.0e-12) {
    printf("warning %e max error for identity background grid\n", max_error);
  }

  return REF_SUCCESS;
}